

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O3

void __thiscall DIS::AggregateStatePdu::marshal(AggregateStatePdu *this,DataStream *dataStream)

{
  uint *puVar1;
  pointer pAVar2;
  pointer pEVar3;
  pointer pEVar4;
  pointer pVVar5;
  ulong uVar6;
  long lVar7;
  AggregateID x;
  VariableDatum local_60;
  
  EntityManagementFamilyPdu::marshal(&this->super_EntityManagementFamilyPdu,dataStream);
  EntityID::marshal(&this->_aggregateID,dataStream);
  DataStream::operator<<(dataStream,this->_forceID);
  DataStream::operator<<(dataStream,this->_aggregateState);
  EntityType::marshal(&this->_aggregateType,dataStream);
  DataStream::operator<<(dataStream,this->_formation);
  AggregateMarking::marshal(&this->_aggregateMarking,dataStream);
  Vector3Float::marshal(&this->_dimensions,dataStream);
  Orientation::marshal(&this->_orientation,dataStream);
  Vector3Double::marshal(&this->_centerOfMass,dataStream);
  Vector3Float::marshal(&this->_velocity,dataStream);
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_aggregateIDList).
                              super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_aggregateIDList).
                             super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_entityIDList).
                              super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_entityIDList).
                             super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_silentAggregateSystemList).
                              super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_silentAggregateSystemList).
                             super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_silentEntitySystemList).
                              super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_silentEntitySystemList).
                             super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4));
  pAVar2 = (this->_aggregateIDList).
           super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_aggregateIDList).
      super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar2) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__AggregateID_0019f338;
      local_60._variableDatumLength._0_2_ =
           *(undefined2 *)((long)&pAVar2->_vptr_AggregateID + lVar7 + 4);
      local_60._variableDatumID = *(uint *)((long)&pAVar2->_vptr_AggregateID + lVar7);
      AggregateID::marshal((AggregateID *)&local_60,dataStream);
      AggregateID::~AggregateID((AggregateID *)&local_60);
      uVar6 = uVar6 + 1;
      pAVar2 = (this->_aggregateIDList).
               super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (ulong)((long)(this->_aggregateIDList).
                                   super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 4));
  }
  pEVar3 = (this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_entityIDList).super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
      _M_impl.super__Vector_impl_data._M_finish != pEVar3) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__EntityID_0019fcb8;
      local_60._variableDatumLength._0_2_ =
           *(undefined2 *)((long)&pEVar3->_vptr_EntityID + lVar7 + 4);
      local_60._variableDatumID = *(uint *)((long)&pEVar3->_vptr_EntityID + lVar7);
      EntityID::marshal((EntityID *)&local_60,dataStream);
      EntityID::~EntityID((EntityID *)&local_60);
      uVar6 = uVar6 + 1;
      pEVar3 = (this->_entityIDList).
               super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (ulong)((long)(this->_entityIDList).
                                   super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 4));
  }
  DataStream::operator<<(dataStream,this->_pad2);
  pEVar4 = (this->_silentAggregateSystemList).
           super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_silentAggregateSystemList).
      super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar4) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__EntityType_0019fe40;
      local_60._8_8_ = *(undefined8 *)((long)&pEVar4->_vptr_EntityType + lVar7);
      EntityType::marshal((EntityType *)&local_60,dataStream);
      EntityType::~EntityType((EntityType *)&local_60);
      uVar6 = uVar6 + 1;
      pEVar4 = (this->_silentAggregateSystemList).
               super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (ulong)((long)(this->_silentAggregateSystemList).
                                   super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 4));
  }
  pEVar4 = (this->_silentEntitySystemList).
           super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_silentEntitySystemList).
      super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar4) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__EntityType_0019fe40;
      local_60._8_8_ = *(undefined8 *)((long)&pEVar4->_vptr_EntityType + lVar7);
      EntityType::marshal((EntityType *)&local_60,dataStream);
      EntityType::~EntityType((EntityType *)&local_60);
      uVar6 = uVar6 + 1;
      pEVar4 = (this->_silentEntitySystemList).
               super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (ulong)((long)(this->_silentEntitySystemList).
                                   super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 4));
  }
  DataStream::operator<<
            (dataStream,
             (int)((ulong)((long)(this->_variableDatumList).
                                 super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_variableDatumList).
                                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555);
  pVVar5 = (this->_variableDatumList).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatumList).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar5) {
    lVar7 = 0x28;
    uVar6 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__VariableDatum_001a1730;
      puVar1 = (uint *)((long)&pVVar5->_vptr_VariableDatum + lVar7);
      local_60._variableDatumID = puVar1[-8];
      local_60._variableDatumLength = puVar1[-7];
      std::vector<char,_std::allocator<char>_>::vector
                (&local_60._variableDatums,(vector<char,_std::allocator<char>_> *)(puVar1 + -6));
      local_60._arrayLength = *puVar1;
      VariableDatum::marshal(&local_60,dataStream);
      VariableDatum::~VariableDatum(&local_60);
      uVar6 = uVar6 + 1;
      pVVar5 = (this->_variableDatumList).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x30;
    } while (uVar6 < (ulong)(((long)(this->_variableDatumList).
                                    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void AggregateStatePdu::marshal(DataStream& dataStream) const
{
    EntityManagementFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _aggregateID.marshal(dataStream);
    dataStream << _forceID;
    dataStream << _aggregateState;
    _aggregateType.marshal(dataStream);
    dataStream << _formation;
    _aggregateMarking.marshal(dataStream);
    _dimensions.marshal(dataStream);
    _orientation.marshal(dataStream);
    _centerOfMass.marshal(dataStream);
    _velocity.marshal(dataStream);
    dataStream << ( unsigned short )_aggregateIDList.size();
    dataStream << ( unsigned short )_entityIDList.size();
    dataStream << ( unsigned short )_silentAggregateSystemList.size();
    dataStream << ( unsigned short )_silentEntitySystemList.size();

     for(size_t idx = 0; idx < _aggregateIDList.size(); idx++)
     {
        AggregateID x = _aggregateIDList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _entityIDList.size(); idx++)
     {
        EntityID x = _entityIDList[idx];
        x.marshal(dataStream);
     }

    dataStream << _pad2;

     for(size_t idx = 0; idx < _silentAggregateSystemList.size(); idx++)
     {
        EntityType x = _silentAggregateSystemList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _silentEntitySystemList.size(); idx++)
     {
        EntityType x = _silentEntitySystemList[idx];
        x.marshal(dataStream);
     }

    dataStream << ( unsigned int )_variableDatumList.size();

     for(size_t idx = 0; idx < _variableDatumList.size(); idx++)
     {
        VariableDatum x = _variableDatumList[idx];
        x.marshal(dataStream);
     }

}